

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.cpp
# Opt level: O0

Rect __thiscall nite::Rect::operator-(Rect *this,float c)

{
  Rect *in_RSI;
  Rect RVar1;
  float c_local;
  Rect *this_local;
  Rect *R;
  
  Rect(this,in_RSI);
  this->x = this->x - c;
  this->y = this->y - c;
  this->w = this->w - c;
  RVar1.x = this->h - c;
  RVar1.y = 0.0;
  this->h = RVar1.x;
  RVar1.w = c;
  RVar1.h = 0.0;
  return RVar1;
}

Assistant:

nite::Rect nite::Rect::operator-(float c){
	Rect R = *this;
	R.x -= c;
	R.y -= c;
	R.w -= c;
	R.h -= c;
	return R;
}